

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*>::
load_impl_sequence<0ul,1ul>
          (argument_loader<sdf_tools::Grid*,sdf_tools::sdf::Sdf_const*> *this,long call)

{
  handle hVar1;
  bool bVar2;
  reference rVar3;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x18),hVar1,(*rVar3._M_p & rVar3._M_mask) != 0);
  if (bVar2) {
    hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),1);
    bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)this,hVar1,(*rVar3._M_p & rVar3._M_mask) != 0);
    return bVar2;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }